

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe9At2(uint8_t *buf)

{
  return (ulong)((buf[1] & 7) << 6 | (uint)(*buf >> 2));
}

Assistant:

std::uint64_t readFlUIntLe9At2(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[1];
    res <<= 6;
    res |= (buf[0] >> 2);
    res &= UINT64_C(0x1ff);
    return res;
}